

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonEachColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int iColumn)

{
  byte *pbVar1;
  Mem *pMVar2;
  u32 i;
  uint uVar3;
  i64 in_RAX;
  _func_void_void_ptr *xDel;
  int iVar4;
  sqlite3_vtab *n;
  sqlite3_vtab *psVar5;
  i64 x;
  
  switch(iColumn) {
  case 0:
    iVar4 = *(int *)((long)&cur[3].pVtab + 4);
    if (iVar4 == 0) {
      if (*(int *)((long)&cur[2].pVtab + 4) == 1) {
        return 0;
      }
      x = in_RAX;
      uVar3 = jsonEachPathLength((JsonEachCursor *)cur);
      iVar4 = *(int *)((long)&cur[2].pVtab + 4) - uVar3;
      if (iVar4 == 0) {
        return 0;
      }
      psVar5 = cur[8].pVtab;
      if (*(char *)((long)&psVar5->pModule + (ulong)uVar3) != '[') {
        if (*(char *)((long)&psVar5->pModule + (ulong)(uVar3 + 1)) == '\"') {
          psVar5 = (sqlite3_vtab *)((long)&psVar5->pModule + (ulong)(uVar3 + 2));
          iVar4 = iVar4 + -3;
        }
        else {
          psVar5 = (sqlite3_vtab *)((long)&psVar5->pModule + (ulong)(uVar3 + 1));
          iVar4 = iVar4 + -1;
        }
        goto LAB_00198996;
      }
      sqlite3Atoi64((char *)((long)&psVar5->pModule + (ulong)(uVar3 + 1)),&x,iVar4 + -1,'\x01');
    }
    else {
      if (*(char *)&cur[3].pVtab == '\f') {
        i = *(u32 *)((long)&cur[1].pVtab + 4);
        goto LAB_001988b5;
      }
      x = (i64)cur[5].pVtab[iVar4 - 1].zErrMsg;
    }
    goto LAB_00198a1c;
  case 1:
    uVar3 = jsonSkipLabel((JsonEachCursor *)cur);
    jsonReturnFromBlob((JsonParse *)(cur + 0x18),uVar3,ctx,1);
    if (10 < (*(byte *)((long)&(cur[0x18].pVtab)->pModule + (ulong)uVar3) & 0xf)) {
      pMVar2 = ctx->pOut;
      pMVar2->eSubtype = 'J';
      pbVar1 = (byte *)((long)&pMVar2->flags + 1);
      *pbVar1 = *pbVar1 | 8;
    }
    break;
  case 2:
    uVar3 = jsonSkipLabel((JsonEachCursor *)cur);
    psVar5 = (sqlite3_vtab *)
             jsonbType[*(byte *)((long)&(cur[0x18].pVtab)->pModule + (ulong)uVar3) & 0xf];
    iVar4 = -1;
    goto LAB_001989a6;
  case 3:
    i = jsonSkipLabel((JsonEachCursor *)cur);
    if (10 < (*(byte *)((long)&(cur[0x18].pVtab)->pModule + (ulong)i) & 0xf)) {
      return 0;
    }
LAB_001988b5:
    jsonReturnFromBlob((JsonParse *)(cur + 0x18),i,ctx,1);
    break;
  case 4:
    x = (i64)*(uint *)((long)&cur[1].pVtab + 4);
    goto LAB_00198a1c;
  case 5:
    iVar4 = *(int *)((long)&cur[3].pVtab + 4);
    if (iVar4 == 0) {
      return 0;
    }
    if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
      return 0;
    }
    x = (i64)*(uint *)&cur[5].pVtab[iVar4 - 1].pModule;
LAB_00198a1c:
    sqlite3_result_int64(ctx,x);
    break;
  case 6:
    psVar5 = cur[10].pVtab;
    n = psVar5;
    if (*(int *)((long)&cur[3].pVtab + 4) != 0) {
      jsonAppendPathName((JsonEachCursor *)cur);
      n = cur[10].pVtab;
    }
    sqlite3_result_text64
              (ctx,(char *)cur[8].pVtab,(sqlite3_uint64)n,(_func_void_void_ptr *)0xffffffffffffffff,
               '\x01');
    cur[10].pVtab = psVar5;
    break;
  case 7:
    uVar3 = jsonEachPathLength((JsonEachCursor *)cur);
    sqlite3_result_text64
              (ctx,(char *)cur[8].pVtab,(ulong)uVar3,(_func_void_void_ptr *)0xffffffffffffffff,
               '\x01');
    break;
  case 8:
    psVar5 = cur[0x1a].pVtab;
    if (psVar5 == (sqlite3_vtab *)0x0) {
      sqlite3_result_blob(ctx,cur[0x18].pVtab,*(int *)&cur[0x19].pVtab,
                          (_func_void_void_ptr *)0xffffffffffffffff);
      return 0;
    }
    iVar4 = -1;
LAB_00198996:
    xDel = (_func_void_void_ptr *)0xffffffffffffffff;
    goto LAB_001989ab;
  default:
    psVar5 = cur[8].pVtab;
    iVar4 = *(int *)((long)&cur[2].pVtab + 4);
LAB_001989a6:
    xDel = (_func_void_void_ptr *)0x0;
LAB_001989ab:
    sqlite3_result_text(ctx,(char *)psVar5,iVar4,xDel);
  }
  return 0;
}

Assistant:

static int jsonEachColumn(
  sqlite3_vtab_cursor *cur,   /* The cursor */
  sqlite3_context *ctx,       /* First argument to sqlite3_result_...() */
  int iColumn                 /* Which column to return */
){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  switch( iColumn ){
    case JEACH_KEY: {
      if( p->nParent==0 ){
        u32 n, j;
        if( p->nRoot==1 ) break;
        j = jsonEachPathLength(p);
        n = p->nRoot - j;
        if( n==0 ){
          break;
        }else if( p->path.zBuf[j]=='[' ){
          i64 x;
          sqlite3Atoi64(&p->path.zBuf[j+1], &x, n-1, SQLITE_UTF8);
          sqlite3_result_int64(ctx, x);
        }else if( p->path.zBuf[j+1]=='"' ){
          sqlite3_result_text(ctx, &p->path.zBuf[j+2], n-3, SQLITE_TRANSIENT);
        }else{
          sqlite3_result_text(ctx, &p->path.zBuf[j+1], n-1, SQLITE_TRANSIENT);
        }
        break;
      }
      if( p->eType==JSONB_OBJECT ){
        jsonReturnFromBlob(&p->sParse, p->i, ctx, 1);
      }else{
        assert( p->eType==JSONB_ARRAY );
        sqlite3_result_int64(ctx, p->aParent[p->nParent-1].iKey);
      }
      break;
    }
    case JEACH_VALUE: {
      u32 i = jsonSkipLabel(p);
      jsonReturnFromBlob(&p->sParse, i, ctx, 1);
      if( (p->sParse.aBlob[i] & 0x0f)>=JSONB_ARRAY ){
        sqlite3_result_subtype(ctx, JSON_SUBTYPE);
      }
      break;
    }
    case JEACH_TYPE: {
      u32 i = jsonSkipLabel(p);
      u8 eType = p->sParse.aBlob[i] & 0x0f;
      sqlite3_result_text(ctx, jsonbType[eType], -1, SQLITE_STATIC);
      break;
    }
    case JEACH_ATOM: {
      u32 i = jsonSkipLabel(p);
      if( (p->sParse.aBlob[i] & 0x0f)<JSONB_ARRAY ){
        jsonReturnFromBlob(&p->sParse, i, ctx, 1);
      }
      break;
    }
    case JEACH_ID: {
      sqlite3_result_int64(ctx, (sqlite3_int64)p->i);
      break;
    }
    case JEACH_PARENT: {
      if( p->nParent>0 && p->bRecursive ){
        sqlite3_result_int64(ctx, p->aParent[p->nParent-1].iHead);
      }
      break;
    }
    case JEACH_FULLKEY: {
      u64 nBase = p->path.nUsed;
      if( p->nParent ) jsonAppendPathName(p);
      sqlite3_result_text64(ctx, p->path.zBuf, p->path.nUsed,
                            SQLITE_TRANSIENT, SQLITE_UTF8);
      p->path.nUsed = nBase;
      break;
    }
    case JEACH_PATH: {
      u32 n = jsonEachPathLength(p);
      sqlite3_result_text64(ctx, p->path.zBuf, n,
                            SQLITE_TRANSIENT, SQLITE_UTF8);
      break;
    }
    default: {
      sqlite3_result_text(ctx, p->path.zBuf, p->nRoot, SQLITE_STATIC);
      break;
    }
    case JEACH_JSON: {
      if( p->sParse.zJson==0 ){
        sqlite3_result_blob(ctx, p->sParse.aBlob, p->sParse.nBlob,
                            SQLITE_TRANSIENT);
      }else{
        sqlite3_result_text(ctx, p->sParse.zJson, -1, SQLITE_TRANSIENT);
      }
      break;
    }
  }
  return SQLITE_OK;
}